

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::initializeYesterday(Datetime *this,Pig *pig)

{
  size_type sVar1;
  bool bVar2;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar3;
  ulong uVar4;
  time_t now;
  string token;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  previous = Pig::cursor(pig);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"yesterday",&local_71);
  bVar2 = Pig::skipPartial(pig,&local_70,&local_50,false);
  sVar1 = local_50._M_string_length;
  if (bVar2) {
    uVar4 = (ulong)minimumMatchLength;
    std::__cxx11::string::~string((string *)&local_70);
    if (uVar4 <= sVar1) {
      c = Pig::peek(pig);
      bVar2 = unicodeLatinAlpha(c);
      if (!bVar2) {
        bVar2 = unicodeLatinDigit(c);
        if (!bVar2) {
          local_70._M_dataplus._M_p = (pointer)time((time_t *)0x0);
          __tp = localtime((time_t *)&local_70);
          __tp->tm_sec = 0;
          __tp->tm_min = 0;
          __tp->tm_hour = 0;
          __tp->tm_isdst = -1;
          __tp->tm_mday = __tp->tm_mday + -1;
          tVar3 = mktime(__tp);
          this->_date = tVar3;
          bVar2 = true;
          goto LAB_001091b1;
        }
      }
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_70);
  }
  Pig::restoreTo(pig,previous);
  bVar2 = false;
LAB_001091b1:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool Datetime::initializeYesterday (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::string token;
  if (pig.skipPartial ("yesterday", token) &&
      token.length () >= static_cast <std::string::size_type> (Datetime::minimumMatchLength))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_isdst = -1;
      t->tm_mday -= 1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}